

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_plastic.hpp
# Opt level: O2

void __thiscall RoughPlasticBSDF::RoughPlasticBSDF(RoughPlasticBSDF *this,Json *conf)

{
  const_reference pvVar1;
  int iVar2;
  bool bVar3;
  float fVar4;
  double dVar5;
  vec3f vVar6;
  MT19937Sampler sampler;
  Sampler local_13a8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  BSDF::BSDF(&this->super_BSDF,conf);
  (this->super_BSDF)._vptr_BSDF = (_func_int **)&PTR_f_00160c28;
  (this->Ks).x = 1.0;
  (this->Ks).y = 1.0;
  (this->Ks).z = 1.0;
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"ior");
  fVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<float,_float,_0>(pvVar1);
  *(float *)&(this->super_BSDF).field_0x24 = fVar4;
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"roughness");
  fVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<float,_float,_0>(pvVar1);
  this->alpha = fVar4;
  local_13a8._vptr_Sampler = (_func_int **)&PTR_get1f_00160108;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13a0,0);
  dVar5 = 0.0;
  iVar2 = 1000000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    vVar6 = Sampler::cosSampleHemisphereSurface(&local_13a8);
    fVar4 = DielectricBRDF::reflectivity(vVar6.z,1.0 / *(float *)&(this->super_BSDF).field_0x24);
    dVar5 = dVar5 + (double)(1.0 - fVar4);
  }
  this->outRatio = (float)(dVar5 / 1000000.0);
  return;
}

Assistant:

RoughPlasticBSDF(const Json& conf): BSDF(conf)
	{
		IOR = conf["ior"];
		alpha = conf["roughness"];
		// precompute outRatio
		// here bruteforcing to demonstrate its physical meaning
		// you can optimize by using approximating polynormial
		MT19937Sampler sampler;
		const int nsample = 1000000;
		double energy = 0; // use double here because accumulating process introduces lots of rounding error
		for (int i=0; i<nsample; ++i) {
			vec3f lambert_out = sampler.cosSampleHemisphereSurface();
			energy += 1 - DielectricBRDF::reflectivity(lambert_out.z, 1/IOR);
		}
		outRatio = energy / nsample;
	}